

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu540c.c
# Opt level: O1

MPP_RET hal_jpege_v540c_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  long lVar2;
  MPP_RET MVar3;
  jpegeV540cHalContext *ctx;
  
  lVar2 = *(long *)((long)hal + 0x78);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) enter\n","hal_jpege_v540c_wait",0x15f);
  }
  if ((task->flags).err == 0) {
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
    if (MVar3 == MPP_OK) {
      uVar1 = **(uint **)((long)hal + 0x78);
      _mpp_log_l(2,"hal_jpege_v540c","hw_status: 0x%08x","hal_jpege_vepu540c_status_check",
                 (ulong)uVar1);
      if ((uVar1 & 2) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_LINKTABLE_FINISH",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 & 1) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_ONE_FRAME_FINISH",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 & 8) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_ONE_SLICE_FINISH",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 & 4) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_SAFE_CLEAR_FINISH",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 & 0x10) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_BIT_STREAM_OVERFLOW",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 & 0x20) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_BUS_WRITE_FULL",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 & 0x40) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_BUS_WRITE_ERROR",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((char)uVar1 < '\0') {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_BUS_READ_ERROR",
                   "hal_jpege_vepu540c_status_check");
      }
      if ((uVar1 >> 8 & 1) != 0) {
        _mpp_log_l(2,"hal_jpege_v540c","RKV_ENC_INT_TIMEOUT_ERROR","hal_jpege_vepu540c_status_check"
                  );
      }
      task->hw_length = task->hw_length + *(int *)(lVar2 + 0x68);
      MVar3 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"hal_jpege_v540c","poll cmd failed %d\n","hal_jpege_v540c_wait",
                 (ulong)(uint)MVar3);
      MVar3 = MPP_ERR_VPUHW;
    }
    if (((byte)hal_jpege_debug & 1) != 0) {
      _mpp_log_l(4,"hal_jpege_v540c","(%d) leave\n","hal_jpege_v540c_wait",0x170);
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_v540c","enc_task->flags.err %08x, return early","hal_jpege_v540c_wait");
    MVar3 = MPP_NOK;
  }
  return MVar3;
}

Assistant:

MPP_RET hal_jpege_v540c_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    jpegeV540cHalContext *ctx = (jpegeV540cHalContext *)hal;
    HalEncTask *enc_task = task;
    JpegV540cStatus *elem = (JpegV540cStatus *)ctx->reg_out;
    hal_jpege_enter();

    if (enc_task->flags.err) {
        mpp_err_f("enc_task->flags.err %08x, return early",
                  enc_task->flags.err);
        return MPP_NOK;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret) {
        mpp_err_f("poll cmd failed %d\n", ret);
        ret = MPP_ERR_VPUHW;
    } else {
        hal_jpege_vepu540c_status_check(hal);
        task->hw_length += elem->st.jpeg_head_bits_l32;
    }

    hal_jpege_leave();
    return ret;
}